

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O0

void __thiscall slang::Bag::set<slang::parsing::ParserOptions&>(Bag *this,ParserOptions *item)

{
  bool bVar1;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *in_RSI;
  any *in_RDI;
  locator loc;
  size_t pos0;
  size_t hash;
  type_index *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  equal_to<std::type_index> *in_stack_fffffffffffffe58;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *in_stack_fffffffffffffe60;
  any *args;
  any *hash_00;
  type_index in_stack_fffffffffffffe88;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *this_00;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_160;
  try_emplace_args_t *local_148;
  type_index *in_stack_fffffffffffffec8;
  try_emplace_args_t *args_00;
  any *hash_01;
  undefined7 in_stack_fffffffffffffee0;
  bool in_stack_fffffffffffffee7;
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::type_index,_std::any>_>
  local_a8;
  size_t local_90;
  size_t local_88;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *local_80;
  try_emplace_args_t *local_78;
  undefined1 *local_70;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *local_10;
  
  this_00 = in_RSI;
  std::type_index::type_index
            ((type_index *)&stack0xfffffffffffffe88,(type_info *)&parsing::ParserOptions::typeinfo);
  local_148 = (try_emplace_args_t *)&stack0xfffffffffffffe88;
  local_70 = &stack0xfffffffffffffecf;
  args = in_RDI;
  args_00 = local_148;
  hash_01 = in_RDI;
  local_78 = local_148;
  local_80 = (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                ::key_from<std::type_index>(local_148);
  local_88 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
             ::hash_for<std::type_index>
                       (in_stack_fffffffffffffe60,(type_index *)in_stack_fffffffffffffe58);
  local_90 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
             ::position_for(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
  local_10 = local_80;
  local_20 = local_88;
  hash_00 = args;
  local_18 = local_90;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_90);
  while( true ) {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
               ::groups((table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                         *)0x1a35cf);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)in_RSI,
                       (size_t)in_stack_fffffffffffffe60);
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 ::elements((table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                             *)0x1a361a);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffe58 =
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                     *)0x1a366a);
        in_stack_fffffffffffffe60 = local_10;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
        ::key_from<std::pair<std::type_index_const,std::any>>
                  ((pair<const_std::type_index,_std::any> *)0x1a3696);
        bVar1 = std::equal_to<std::type_index>::operator()
                          ((equal_to<std::type_index> *)in_stack_fffffffffffffe60,
                           (type_index *)in_stack_fffffffffffffe58,(type_index *)0x1a36a7);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::type_index,_std::any>_>
          ::table_locator(&local_a8,local_40,local_5c,local_58 + local_5c);
          goto LAB_001a3789;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    if (bVar1) break;
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,(size_t)hash_00->_M_storage);
    if (!bVar1) {
      memset(&local_a8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::type_index,_std::any>_>
      ::table_locator(&local_a8);
LAB_001a3789:
      bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_a8);
      if (bVar1) {
        local_b8 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   ::make_iterator((locator *)0x1a37a9);
        local_b9 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_160,&local_b8,&local_b9);
      }
      else if (args[2]._M_storage._M_ptr < args[2]._M_manager) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
        ::unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
                  (this_00,(size_t)in_stack_fffffffffffffe88._M_target,(size_t)hash_00,
                   (try_emplace_args_t *)args,(type_index *)in_RDI);
        local_d0 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   ::make_iterator((locator *)0x1a382e);
        local_e9[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_160,&local_d0,local_e9);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
                  ((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                    *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),(size_t)hash_01,
                   args_00,in_stack_fffffffffffffec8);
        local_100 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                    ::make_iterator((locator *)0x1a3899);
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_160,&local_100,(bool *)&stack0xfffffffffffffee7);
      }
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                    *)in_stack_fffffffffffffe60);
      std::any::operator=(in_RDI,(ParserOptions *)in_RSI);
      return;
    }
  }
  memset(&local_a8,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::type_index,_std::any>_>
  ::table_locator(&local_a8);
  goto LAB_001a3789;
}

Assistant:

void set(T&& item) {
        items[SLANG_TYPEOF(T)] = std::forward<T>(item);
    }